

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void set_operand_size(m680x_info *info,cs_m680x_op *op,uint8_t default_size)

{
  m680x_insn mVar1;
  uint8_t uVar2;
  
  mVar1 = info->insn;
  if (0x8b < (int)mVar1) {
    if (mVar1 - M680X_INS_JMP < 2) {
      uVar2 = '\0';
      goto LAB_0025eb20;
    }
    if (mVar1 == M680X_INS_EMACS) {
LAB_0025eb1e:
      uVar2 = '\x04';
      goto LAB_0025eb20;
    }
    if (mVar1 == M680X_INS_MOVW) goto LAB_0025eaff;
LAB_0025eb0b:
    uVar2 = '\x01';
    if (((info->m680x).op_count != '\0') && ((info->m680x).operands[0].type == M680X_OP_REGISTER)) {
      uVar2 = (info->m680x).operands[0].size;
    }
    goto LAB_0025eb20;
  }
  if (mVar1 - M680X_INS_AIS < 2) {
    if (op->type == M680X_OP_REGISTER) {
      if (mVar1 != M680X_INS_MOVW) {
        if (mVar1 == M680X_INS_EMACS) goto LAB_0025eb1e;
        goto LAB_0025eaf8;
      }
      goto LAB_0025eaff;
    }
  }
  else if (mVar1 != M680X_INS_DIVD) {
LAB_0025eaf8:
    if (mVar1 != M680X_INS_DIVQ) goto LAB_0025eb0b;
LAB_0025eaff:
    uVar2 = '\x02';
    goto LAB_0025eb20;
  }
  uVar2 = '\x01';
LAB_0025eb20:
  op->size = uVar2;
  return;
}

Assistant:

static void set_operand_size(m680x_info *info, cs_m680x_op *op,
	uint8_t default_size)
{
	cs_m680x *m680x = &info->m680x;

	if (info->insn == M680X_INS_JMP || info->insn == M680X_INS_JSR)
		op->size = 0;
	else if (info->insn == M680X_INS_DIVD ||
		((info->insn == M680X_INS_AIS || info->insn == M680X_INS_AIX) &&
			op->type != M680X_OP_REGISTER))
		op->size = 1;
	else if (info->insn == M680X_INS_DIVQ ||
		info->insn == M680X_INS_MOVW)
		op->size = 2;
	else if (info->insn == M680X_INS_EMACS)
		op->size = 4;
	else if ((m680x->op_count > 0) &&
		(m680x->operands[0].type == M680X_OP_REGISTER))
		op->size = m680x->operands[0].size;
	else
		op->size = default_size;
}